

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

UBool uprv_isInvariantUString_63(UChar *s,int32_t length)

{
  UChar local_1e;
  int local_1c;
  UChar c;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *s_local;
  
  local_1c = length;
  pUStack_18 = s;
  do {
    if (local_1c < 0) {
      local_1e = *pUStack_18;
      if (local_1e == L'\0') {
        return '\x01';
      }
    }
    else {
      if (local_1c == 0) {
        return '\x01';
      }
      local_1c = local_1c + -1;
      local_1e = *pUStack_18;
    }
    pUStack_18 = pUStack_18 + 1;
  } while (((ushort)local_1e < 0x80) &&
          ((invariantChars[(int)(uint)(ushort)local_1e >> 5] & 1 << ((byte)local_1e & 0x1f)) != 0));
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
uprv_isInvariantUString(const UChar *s, int32_t length) {
    UChar c;

    for(;;) {
        if(length<0) {
            /* NUL-terminated */
            c=*s++;
            if(c==0) {
                break;
            }
        } else {
            /* count length */
            if(length==0) {
                break;
            }
            --length;
            c=*s++;
        }

        /*
         * no assertions here because these functions are legitimately called
         * for strings with variant characters
         */
        if(!UCHAR_IS_INVARIANT(c)) {
            return FALSE; /* found a variant char */
        }
    }
    return TRUE;
}